

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLSSetJacTimes(void *arkode_mem,ARKLsJacTimesSetupFn jtsetup,ARKLsJacTimesVecFn jtimes)

{
  int iVar1;
  ARKRhsFn p_Var2;
  char *msgfmt;
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  
  iVar1 = arkLs_AccessLMem(arkode_mem,"arkLSSetJacTimes",&ark_mem,&arkls_mem);
  if (iVar1 != 0) {
    return iVar1;
  }
  if (arkls_mem->LS->ops->setatimes == (_func_int_SUNLinearSolver_void_ptr_SUNATimesFn *)0x0) {
    msgfmt = "SUNLinearSolver object does not support user-supplied ATimes routine";
  }
  else {
    if (jtimes != (ARKLsJacTimesVecFn)0x0) {
      arkls_mem->jtimesDQ = 0;
      arkls_mem->jtsetup = jtsetup;
      arkls_mem->jtimes = jtimes;
      arkls_mem->Jt_data = ark_mem->user_data;
      return 0;
    }
    arkls_mem->jtimesDQ = 1;
    arkls_mem->jtsetup = (ARKLsJacTimesSetupFn)0x0;
    arkls_mem->jtimes = arkLsDQJtimes;
    arkls_mem->Jt_data = ark_mem;
    p_Var2 = (*ark_mem->step_getimplicitrhs)(arkode_mem);
    arkls_mem->Jt_f = p_Var2;
    if (p_Var2 != (ARKRhsFn)0x0) {
      return 0;
    }
    msgfmt = "Time step module is missing implicit RHS fcn";
  }
  arkProcessError(ark_mem,-3,"ARKLS","arkLSSetJacTimes",msgfmt);
  return -3;
}

Assistant:

int arkLSSetJacTimes(void *arkode_mem,
                     ARKLsJacTimesSetupFn jtsetup,
                     ARKLsJacTimesVecFn jtimes)
{
  ARKodeMem ark_mem;
  ARKLsMem  arkls_mem;
  int       retval;

  /* access ARKLsMem structure */
  retval = arkLs_AccessLMem(arkode_mem, "arkLSSetJacTimes",
                            &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS)  return(retval);

  /* issue error if LS object does not allow user-supplied ATimes */
  if (arkls_mem->LS->ops->setatimes == NULL) {
    arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                    "arkLSSetJacTimes",
                    "SUNLinearSolver object does not support user-supplied ATimes routine");
    return(ARKLS_ILL_INPUT);
  }

  /* store function pointers for user-supplied routines in ARKLs
     interface (NULL jtimes implies use of DQ default) */
  if (jtimes != NULL) {
    arkls_mem->jtimesDQ = SUNFALSE;
    arkls_mem->jtsetup  = jtsetup;
    arkls_mem->jtimes   = jtimes;
    arkls_mem->Jt_data  = ark_mem->user_data;
  } else {
    arkls_mem->jtimesDQ = SUNTRUE;
    arkls_mem->jtsetup  = NULL;
    arkls_mem->jtimes   = arkLsDQJtimes;
    arkls_mem->Jt_data  = ark_mem;
    arkls_mem->Jt_f     = ark_mem->step_getimplicitrhs(arkode_mem);

    if (arkls_mem->Jt_f == NULL) {
      arkProcessError(ark_mem, ARKLS_ILL_INPUT, "ARKLS",
                      "arkLSSetJacTimes",
                      "Time step module is missing implicit RHS fcn");
      return(ARKLS_ILL_INPUT);
    }
  }

  return(ARKLS_SUCCESS);
}